

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_Dialog.cxx
# Opt level: O2

void __thiscall Fl_Help_Dialog::cb_back__i(Fl_Help_Dialog *this,Fl_Button *param_1,void *param_2)

{
  int top;
  int iVar1;
  int iVar2;
  char *__s1;
  Fl_Help_View *this_00;
  
  iVar1 = this->index_;
  if (0 < iVar1) {
    iVar1 = iVar1 + -1;
    this->index_ = iVar1;
  }
  if (iVar1 == 0) {
    Fl_Widget::deactivate(&this->back_->super_Fl_Widget);
  }
  Fl_Widget::activate(&this->forward_->super_Fl_Widget);
  iVar1 = this->index_;
  top = this->line_[iVar1];
  this_00 = this->view_;
  __s1 = (char *)0x0;
  if (this_00->filename_[0] != '\0') {
    __s1 = this_00->filename_;
  }
  iVar2 = strcmp(__s1,this->file_[iVar1]);
  if (iVar2 != 0) {
    Fl_Help_View::load(this_00,this->file_[iVar1]);
    this_00 = this->view_;
  }
  Fl_Help_View::topline(this_00,top);
  return;
}

Assistant:

void Fl_Help_Dialog::cb_back__i(Fl_Button*, void*) {
  if (index_ > 0)
  index_ --;

if (index_ == 0)
  back_->deactivate();

forward_->activate();

int l = line_[index_];

if (strcmp(view_->filename(), file_[index_]) != 0)
  view_->load(file_[index_]);

view_->topline(l);
}